

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

timestamp_t duckdb::TimestampRangeInfo::DefaultStart(void)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Default start not implemented for timestamp range","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static timestamp_t DefaultStart() {
		throw InternalException("Default start not implemented for timestamp range");
	}